

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

Matrix<double> * __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
compute_opt_strategy_postL
          (Matrix<double> *__return_storage_ptr__,
          APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
          *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2)

{
  allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_> *paVar1;
  allocator<long_long> *paVar2;
  allocator<double> *this_00;
  double dVar3;
  value_type vVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> *pvVar13;
  double dVar14;
  bool bVar15;
  const_reference cVar16;
  int iVar17;
  vector<long_long,_std::allocator<long_long>_> *this_01;
  const_reference pvVar18;
  size_t row;
  const_reference pvVar19;
  reference pvVar20;
  double *pdVar21;
  reference pvVar22;
  reference pvVar23;
  reference pvVar24;
  int *piVar25;
  long lVar26;
  element_type *peVar27;
  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var28;
  long lVar29;
  double local_4a0;
  longlong *local_498;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_490;
  double local_488;
  longlong *local_480;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_478;
  double local_470;
  longlong *local_468;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_460;
  double local_458;
  longlong tmpCost;
  int w;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_440;
  int local_434;
  longlong *local_430;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_428;
  int local_41c;
  longlong *local_418;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_410;
  int local_404;
  longlong *local_400;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_3f8;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> local_3f0;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> local_3e0;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> local_3d0;
  int local_3c0;
  int local_3bc;
  int i;
  int v;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_I;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_R;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_L;
  int w_in_preL;
  int v_in_preL;
  bool is_v_leaf;
  longlong descSum_v;
  longlong revkrSum_v;
  longlong krSum_v;
  size_t strategypointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Ipointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Rpointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Lpointer_parent_v;
  size_t strategypointer_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Ipointer_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Rpointer_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Lpointer_v;
  double rightPath_v;
  double leftPath_v;
  int parent_v_postL;
  int size_w;
  int parent_w_postL;
  int parent_w_preL;
  int parent_v_preL;
  int size_v;
  vector<int,_std::allocator<int>_> *postL_to_preL_2;
  vector<int,_std::allocator<int>_> *postL_to_preL_1;
  vector<int,_std::allocator<int>_> *preL_to_postL_2;
  vector<int,_std::allocator<int>_> *preL_to_postL_1;
  vector<bool,_std::allocator<bool>_> *nodeType_R_2;
  vector<bool,_std::allocator<bool>_> *nodeType_R_1;
  vector<bool,_std::allocator<bool>_> *nodeType_L_2;
  vector<bool,_std::allocator<bool>_> *nodeType_L_1;
  vector<int,_std::allocator<int>_> *pre2parent2;
  vector<int,_std::allocator<int>_> *pre2parent1;
  vector<int,_std::allocator<int>_> *preR_to_preL_2;
  vector<int,_std::allocator<int>_> *preR_to_preL_1;
  vector<int,_std::allocator<int>_> *preL_to_preR_2;
  vector<int,_std::allocator<int>_> *preL_to_preR_1;
  vector<long_long,_std::allocator<long_long>_> *pre2revkrSum2;
  vector<long_long,_std::allocator<long_long>_> *pre2revkrSum1;
  vector<long_long,_std::allocator<long_long>_> *pre2krSum2;
  vector<long_long,_std::allocator<long_long>_> *pre2krSum1;
  vector<long_long,_std::allocator<long_long>_> *pre2descSum2;
  vector<long_long,_std::allocator<long_long>_> *pre2descSum1;
  vector<int,_std::allocator<int>_> *pre2size2;
  vector<int,_std::allocator<int>_> *pre2size1;
  double strategyPath;
  longlong minCost;
  double pathIDOffset;
  undefined1 local_138 [8];
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> leafRow;
  undefined1 local_120 [8];
  vector<double,_std::allocator<double>_> cost2_path;
  undefined1 local_100 [8];
  vector<long_long,_std::allocator<long_long>_> cost2_I;
  undefined1 local_e0 [8];
  vector<long_long,_std::allocator<long_long>_> cost2_R;
  undefined1 local_c0 [8];
  vector<long_long,_std::allocator<long_long>_> cost2_L;
  undefined1 local_a0 [8];
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_I;
  undefined1 local_80 [8];
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_R;
  allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_> local_51;
  undefined1 local_50 [8];
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_L;
  int size2;
  int size1;
  TreeIndexAPTED *t2_local;
  TreeIndexAPTED *t1_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  Matrix<double> *strategy;
  
  iVar5 = (t1->super_Constants).tree_size_;
  iVar6 = (t2->super_Constants).tree_size_;
  cost1_L.
  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  data_structures::Matrix<double>::Matrix(__return_storage_ptr__,(long)iVar5,(long)iVar6);
  std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>::allocator
            (&local_51);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            *)local_50,(long)iVar5,&local_51);
  std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>::~allocator
            (&local_51);
  paVar1 = (allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_> *)
           ((long)&cost1_I.
                   super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>::allocator
            (paVar1);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            *)local_80,(long)iVar5,paVar1);
  std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>::~allocator
            ((allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_> *)
             ((long)&cost1_I.
                     super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_> *)
           ((long)&cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>::allocator
            (paVar1);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            *)local_a0,(long)iVar5,paVar1);
  std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>::~allocator
            ((allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_> *)
             ((long)&cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar2 = (allocator<long_long> *)
           ((long)&cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long_long>::allocator(paVar2);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_c0,(long)iVar6,paVar2);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar2 = (allocator<long_long> *)
           ((long)&cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long_long>::allocator(paVar2);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_e0,(long)iVar6,paVar2);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar2 = (allocator<long_long> *)
           ((long)&cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long_long>::allocator(paVar2);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_100,(long)iVar6,paVar2);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  this_00 = (allocator<double> *)
            ((long)&leafRow.
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 7);
  std::allocator<double>::allocator(this_00);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_120,(long)iVar6,this_00);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&leafRow.
                     super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  this_01 = (vector<long_long,_std::allocator<long_long>_> *)operator_new(0x18);
  pathIDOffset._6_1_ = 1;
  std::allocator<long_long>::allocator((allocator<long_long> *)((long)&pathIDOffset + 7));
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (this_01,(long)iVar6,(allocator<long_long> *)((long)&pathIDOffset + 7));
  pathIDOffset._6_1_ = 0;
  std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>::
  shared_ptr<std::vector<long_long,std::allocator<long_long>>,void>
            ((shared_ptr<std::vector<long_long,std::allocator<long_long>>> *)local_138,this_01);
  std::allocator<long_long>::~allocator((allocator<long_long> *)((long)&pathIDOffset + 7));
  minCost = (longlong)(double)iVar5;
  strategyPath = (double)std::numeric_limits<long_long>::max();
  pre2size1 = (vector<int,_std::allocator<int>_> *)0xbff0000000000000;
  pre2size2 = &(t1->super_PreLToSize).prel_to_size_;
  pre2descSum1 = (vector<long_long,_std::allocator<long_long>_> *)&t2->super_PreLToSize;
  pre2descSum2 = &(t1->super_PreLToSpfCost).prel_to_cost_all_;
  pre2krSum1 = &(t2->super_PreLToSpfCost).prel_to_cost_all_;
  pre2krSum2 = &(t1->super_PreLToSpfCost).prel_to_cost_left_;
  pre2revkrSum1 = &(t2->super_PreLToSpfCost).prel_to_cost_left_;
  pre2revkrSum2 = &(t1->super_PreLToSpfCost).prel_to_cost_right_;
  preL_to_preR_1 =
       (vector<int,_std::allocator<int>_> *)&(t2->super_PreLToSpfCost).prel_to_cost_right_;
  preL_to_preR_2 = &(t1->super_PreLToPreR).prel_to_prer_;
  preR_to_preL_1 = &(t2->super_PreLToPreR).prel_to_prer_;
  preR_to_preL_2 = &(t1->super_PreRToPreL).prer_to_prel_;
  pre2parent1 = &(t2->super_PreRToPreL).prer_to_prel_;
  pre2parent2 = &(t1->super_PreLToParent).prel_to_parent_;
  nodeType_L_1 = (vector<bool,_std::allocator<bool>_> *)&t2->super_PreLToParent;
  nodeType_L_2 = &(t1->super_PreLToTypeLeft).prel_to_type_left_;
  nodeType_R_1 = &(t2->super_PreLToTypeLeft).prel_to_type_left_;
  nodeType_R_2 = &(t1->super_PreLToTypeRight).prel_to_type_right_;
  preL_to_postL_1 = (vector<int,_std::allocator<int>_> *)&t2->super_PreLToTypeRight;
  preL_to_postL_2 = &(t1->super_PreLToPostL).prel_to_postl_;
  postL_to_preL_1 = &(t2->super_PreLToPostL).prel_to_postl_;
  postL_to_preL_2 = &(t1->super_PostLToPreL).postl_to_prel_;
  _parent_v_preL = &t2->super_PostLToPreL;
  parent_w_preL = -1;
  parent_w_postL = -1;
  size_w = -1;
  parent_v_postL = -1;
  leftPath_v._4_4_ = -1;
  leftPath_v._0_4_ = -1;
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Rpointer_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Ipointer_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)&strategypointer_v);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Rpointer_parent_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Ipointer_parent_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &strategypointer_parent_v);
  std::
  stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
  ::
  stack<std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>,void>
            ((stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
              *)&rowsToReuse_R.c.
                 super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
  ::
  stack<std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>,void>
            ((stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
              *)&rowsToReuse_I.c.
                 super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
  ::
  stack<std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>,void>
            ((stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
              *)&i);
  for (local_3bc = 0; local_3bc < iVar5; local_3bc = local_3bc + 1) {
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](postL_to_preL_2,(long)local_3bc);
    iVar7 = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&(t1->super_PreLToSize).prel_to_size_,(long)iVar7);
    iVar8 = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pre2parent2,(long)iVar7);
    parent_w_postL = *pvVar18;
    if (parent_w_postL != -1) {
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (preL_to_postL_2,(long)parent_w_postL);
      leftPath_v._0_4_ = *pvVar18;
    }
    row = (size_t)iVar7;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pre2size2,(long)iVar7);
    pvVar13 = preR_to_preL_2;
    parent_w_preL = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](preL_to_preR_2,(long)iVar7);
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                        (pvVar13,(long)(*pvVar18 + parent_w_preL + -1));
    iVar9 = *pvVar18;
    iVar17 = iVar7 + parent_w_preL;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[](pre2krSum2,(long)iVar7)
    ;
    lVar10 = *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        (pre2revkrSum2,(long)iVar7);
    lVar11 = *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        (pre2descSum2,(long)iVar7);
    lVar12 = *pvVar19;
    if (iVar8 == 1) {
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_50,(long)local_3bc);
      std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                (pvVar20,(shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
                         local_138);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_80,(long)local_3bc);
      std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                (pvVar20,(shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
                         local_138);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_a0,(long)local_3bc);
      std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                (pvVar20,(shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
                         local_138);
      for (local_3c0 = 0; local_3c0 < iVar6; local_3c0 = local_3c0 + 1) {
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&_parent_v_preL->postl_to_prel_,(long)local_3c0);
        pdVar21 = data_structures::Matrix<double>::at(__return_storage_ptr__,row,(long)*pvVar18);
        *pdVar21 = (double)iVar7;
      }
    }
    pvVar20 = std::
              vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            *)local_50,(long)local_3bc);
    std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
              ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
               &cost_Rpointer_v.
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pvVar20);
    pvVar20 = std::
              vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            *)local_80,(long)local_3bc);
    std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
              ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
               &cost_Ipointer_v.
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pvVar20);
    pvVar20 = std::
              vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            *)local_a0,(long)local_3bc);
    std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
              ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)&strategypointer_v
               ,pvVar20);
    if (parent_w_postL != -1) {
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_50,(long)leftPath_v._0_4_);
      bVar15 = std::operator==(pvVar20,(nullptr_t)0x0);
      if (bVar15) {
        bVar15 = std::
                 stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                 ::empty((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                          *)&rowsToReuse_R.c.
                             super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node);
        if (bVar15) {
          std::make_shared<std::vector<long_long,std::allocator<long_long>>,int_const&>
                    ((int *)&local_3d0);
          pvVar20 = std::
                    vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)local_50,(long)leftPath_v._0_4_);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                    (pvVar20,&local_3d0);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
                    (&local_3d0);
          std::make_shared<std::vector<long_long,std::allocator<long_long>>,int_const&>
                    ((int *)&local_3e0);
          pvVar20 = std::
                    vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)local_80,(long)leftPath_v._0_4_);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                    (pvVar20,&local_3e0);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
                    (&local_3e0);
          std::make_shared<std::vector<long_long,std::allocator<long_long>>,int_const&>
                    ((int *)&local_3f0);
          pvVar20 = std::
                    vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)local_a0,(long)leftPath_v._0_4_);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                    (pvVar20,&local_3f0);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
                    (&local_3f0);
        }
        else {
          pvVar22 = std::
                    stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                    ::top((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                           *)&rowsToReuse_R.c.
                              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node);
          pvVar20 = std::
                    vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)local_50,(long)leftPath_v._0_4_);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                    (pvVar20,pvVar22);
          pvVar22 = std::
                    stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                    ::top((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                           *)&rowsToReuse_I.c.
                              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node);
          pvVar20 = std::
                    vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)local_80,(long)leftPath_v._0_4_);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                    (pvVar20,pvVar22);
          pvVar22 = std::
                    stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                    ::top((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                           *)&i);
          pvVar20 = std::
                    vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)local_a0,(long)leftPath_v._0_4_);
          std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                    (pvVar20,pvVar22);
          std::
          stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
          ::pop((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                 *)&rowsToReuse_R.c.
                    super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
          std::
          stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
          ::pop((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                 *)&rowsToReuse_I.c.
                    super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
          std::
          stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
          ::pop((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
                 *)&i);
        }
      }
    }
    if (parent_w_postL != -1) {
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_50,(long)leftPath_v._0_4_);
      std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
                 &cost_Rpointer_parent_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,pvVar20);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_80,(long)leftPath_v._0_4_);
      std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
                 &cost_Ipointer_parent_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,pvVar20);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_a0,(long)leftPath_v._0_4_);
      std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::operator=
                ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
                 &strategypointer_parent_v,pvVar20);
      krSum_v = (longlong)parent_w_postL;
    }
    local_3f8._M_current =
         (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::begin
                   ((vector<long_long,_std::allocator<long_long>_> *)local_c0);
    local_400 = (longlong *)
                std::vector<long_long,_std::allocator<long_long>_>::end
                          ((vector<long_long,_std::allocator<long_long>_> *)local_c0);
    local_404 = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,int>
              (local_3f8,
               (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
               local_400,&local_404);
    local_410._M_current =
         (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::begin
                   ((vector<long_long,_std::allocator<long_long>_> *)local_e0);
    local_418 = (longlong *)
                std::vector<long_long,_std::allocator<long_long>_>::end
                          ((vector<long_long,_std::allocator<long_long>_> *)local_e0);
    local_41c = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,int>
              (local_410,
               (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
               local_418,&local_41c);
    local_428._M_current =
         (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::begin
                   ((vector<long_long,_std::allocator<long_long>_> *)local_100);
    local_430 = (longlong *)
                std::vector<long_long,_std::allocator<long_long>_>::end
                          ((vector<long_long,_std::allocator<long_long>_> *)local_100);
    local_434 = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,int>
              (local_428,
               (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
               local_430,&local_434);
    local_440._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_120);
    _w = std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_120);
    tmpCost._4_4_ = 0;
    std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
              (local_440,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)_w,
               (int *)((long)&tmpCost + 4));
    for (tmpCost._0_4_ = 0; (int)tmpCost < iVar6; tmpCost._0_4_ = (int)tmpCost + 1) {
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&_parent_v_preL->postl_to_prel_,(long)(int)tmpCost);
      iVar8 = *pvVar18;
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)nodeType_L_1,(long)iVar8);
      size_w = *pvVar18;
      if (size_w != -1) {
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](postL_to_preL_1,(long)size_w);
        parent_v_postL = *pvVar18;
      }
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)pre2descSum1,(long)iVar8);
      leftPath_v._4_4_ = *pvVar18;
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&(t2->super_PreLToSize).prel_to_size_,(long)iVar8);
      if (*pvVar18 == 1) {
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_c0,
                             (long)(int)tmpCost);
        *pvVar23 = 0;
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_e0,
                             (long)(int)tmpCost);
        *pvVar23 = 0;
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_100,
                             (long)(int)tmpCost);
        *pvVar23 = 0;
        pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_120,(long)(int)tmpCost
                            );
        *pvVar24 = (double)iVar8;
      }
      strategyPath = (double)std::numeric_limits<long_long>::max();
      pre2size1 = (vector<int,_std::allocator<int>_> *)0xbff0000000000000;
      local_458 = (double)std::numeric_limits<long_long>::max();
      if ((parent_w_preL < 2) || (leftPath_v._4_4_ < 2)) {
        piVar25 = std::max<int>(&parent_w_preL,(int *)((long)&leftPath_v + 4));
        strategyPath = (double)(long)*piVar25;
      }
      else {
        lVar26 = (long)parent_w_preL;
        pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (pre2revkrSum1,(long)iVar8);
        lVar29 = *pvVar19;
        peVar27 = std::
                  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&cost_Rpointer_v.
                                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (peVar27,(long)(int)tmpCost);
        local_458 = (double)(lVar26 * lVar29 + *pvVar23);
        if ((long)local_458 < (long)strategyPath) {
          pre2size1 = (vector<int,_std::allocator<int>_> *)(double)-(iVar9 + 1);
          strategyPath = local_458;
        }
        lVar26 = (long)parent_w_preL;
        pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)preL_to_preR_1,
                             (long)iVar8);
        lVar29 = *pvVar19;
        peVar27 = std::
                  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&cost_Ipointer_v.
                                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (peVar27,(long)(int)tmpCost);
        local_458 = (double)(lVar26 * lVar29 + *pvVar23);
        if ((long)local_458 < (long)strategyPath) {
          pre2size1 = (vector<int,_std::allocator<int>_> *)(double)iVar17;
          strategyPath = local_458;
        }
        lVar26 = (long)parent_w_preL;
        pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (pre2krSum1,(long)iVar8);
        lVar29 = *pvVar19;
        peVar27 = std::
                  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&strategypointer_v);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (peVar27,(long)(int)tmpCost);
        local_458 = (double)(lVar26 * lVar29 + *pvVar23);
        if ((long)local_458 < (long)strategyPath) {
          strategyPath = local_458;
          pdVar21 = data_structures::Matrix<double>::at(__return_storage_ptr__,row,(long)iVar8);
          pre2size1 = (vector<int,_std::allocator<int>_> *)(*pdVar21 + 1.0);
        }
        lVar29 = (long)leftPath_v._4_4_;
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_c0,
                             (long)(int)tmpCost);
        pvVar13 = pre2parent1;
        local_458 = (double)(lVar29 * lVar10 + *pvVar23);
        if ((long)local_458 < (long)strategyPath) {
          strategyPath = local_458;
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](preR_to_preL_1,(long)iVar8);
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                              (pvVar13,(long)(*pvVar18 + leftPath_v._4_4_ + -1));
          pre2size1 = (vector<int,_std::allocator<int>_> *)
                      -((double)*pvVar18 + (double)minCost + 1.0);
        }
        lVar29 = (long)leftPath_v._4_4_;
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_e0,
                             (long)(int)tmpCost);
        local_458 = (double)(lVar29 * lVar11 + *pvVar23);
        if ((long)local_458 < (long)strategyPath) {
          pre2size1 = (vector<int,_std::allocator<int>_> *)
                      ((double)(iVar8 + leftPath_v._4_4_ + -1) + (double)minCost + 1.0);
          strategyPath = local_458;
        }
        lVar29 = (long)leftPath_v._4_4_;
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_100,
                             (long)(int)tmpCost);
        local_458 = (double)(lVar29 * lVar12 + *pvVar23);
        if ((long)local_458 < (long)strategyPath) {
          strategyPath = local_458;
          pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_120,
                               (long)(int)tmpCost);
          pre2size1 = (vector<int,_std::allocator<int>_> *)(*pvVar24 + (double)minCost + 1.0);
        }
      }
      dVar3 = strategyPath;
      if (parent_w_postL != -1) {
        peVar27 = std::
                  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&cost_Ipointer_parent_v.
                                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (peVar27,(long)(int)tmpCost);
        dVar14 = strategyPath;
        *pvVar23 = (long)dVar3 + *pvVar23;
        p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                   *)local_a0,(long)local_3bc);
        peVar27 = std::
                  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*(p_Var28);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (peVar27,(long)(int)tmpCost);
        lVar29 = *pvVar23;
        local_458 = (double)(lVar29 - (long)dVar14);
        p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                   *)local_a0,(long)leftPath_v._0_4_);
        peVar27 = std::
                  __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*(p_Var28);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            (peVar27,(long)(int)tmpCost);
        dVar3 = local_458;
        if (lVar29 - (long)dVar14 < *pvVar23) {
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&strategypointer_parent_v);
          pdVar21 = (double *)
                    std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          *pdVar21 = dVar3;
          pdVar21 = data_structures::Matrix<double>::read_at(__return_storage_ptr__,row,(long)iVar8)
          ;
          dVar3 = *pdVar21;
          pdVar21 = data_structures::Matrix<double>::at(__return_storage_ptr__,krSum_v,(long)iVar8);
          *pdVar21 = dVar3;
        }
        cVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](nodeType_R_2,(long)iVar7);
        if (cVar16) {
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost_Ipointer_parent_v.
                                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          lVar29 = *pvVar23;
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&strategypointer_parent_v);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          *pvVar23 = lVar29 + *pvVar23;
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost_Ipointer_v.
                                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          lVar29 = *pvVar23 - (long)strategyPath;
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost_Ipointer_parent_v.
                                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          *pvVar23 = lVar29 + *pvVar23;
        }
        cVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](nodeType_L_2,(long)iVar7);
        dVar3 = strategyPath;
        if (cVar16) {
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost_Rpointer_v.
                                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          lVar29 = *pvVar23;
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost_Rpointer_parent_v.
                                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          *pvVar23 = lVar29 + *pvVar23;
        }
        else {
          peVar27 = std::
                    __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&cost_Rpointer_parent_v.
                                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              (peVar27,(long)(int)tmpCost);
          *pvVar23 = (long)dVar3 + *pvVar23;
        }
      }
      dVar3 = strategyPath;
      if (size_w != -1) {
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_e0,
                             (long)parent_v_postL);
        dVar14 = strategyPath;
        *pvVar23 = (long)dVar3 + *pvVar23;
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_100,
                             (long)(int)tmpCost);
        lVar29 = *pvVar23;
        local_458 = (double)(lVar29 - (long)dVar14);
        pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                            ((vector<long_long,_std::allocator<long_long>_> *)local_100,
                             (long)parent_v_postL);
        dVar3 = local_458;
        if (lVar29 - (long)dVar14 < *pvVar23) {
          pdVar21 = (double *)
                    std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_100,
                               (long)parent_v_postL);
          *pdVar21 = dVar3;
          pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_120,
                               (long)(int)tmpCost);
          vVar4 = *pvVar24;
          pvVar24 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_120,
                               (long)parent_v_postL);
          *pvVar24 = vVar4;
        }
        cVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)preL_to_postL_1,(long)iVar8);
        if (cVar16) {
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_e0,
                               (long)parent_v_postL);
          lVar29 = *pvVar23;
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_100,
                               (long)parent_v_postL);
          *pvVar23 = lVar29 + *pvVar23;
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_e0,
                               (long)(int)tmpCost);
          lVar29 = *pvVar23 - (long)strategyPath;
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_e0,
                               (long)parent_v_postL);
          *pvVar23 = lVar29 + *pvVar23;
        }
        cVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](nodeType_R_1,(long)iVar8);
        dVar3 = strategyPath;
        if (cVar16) {
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_c0,
                               (long)(int)tmpCost);
          lVar29 = *pvVar23;
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_c0,
                               (long)parent_v_postL);
          *pvVar23 = lVar29 + *pvVar23;
        }
        else {
          pvVar23 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                              ((vector<long_long,_std::allocator<long_long>_> *)local_c0,
                               (long)parent_v_postL);
          *pvVar23 = (long)dVar3 + *pvVar23;
        }
      }
      pvVar13 = pre2size1;
      pdVar21 = data_structures::Matrix<double>::at(__return_storage_ptr__,row,(long)iVar8);
      *pdVar21 = (double)pvVar13;
    }
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&(t1->super_PreLToSize).prel_to_size_,(long)iVar7);
    if (*pvVar18 != 1) {
      p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_50,(long)local_3bc);
      peVar27 = std::
                __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var28);
      local_460._M_current =
           (longlong *)std::vector<long_long,_std::allocator<long_long>_>::begin(peVar27);
      p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_50,(long)local_3bc);
      peVar27 = std::
                __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var28);
      local_468 = (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(peVar27);
      local_470 = 0.0;
      std::
      fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,double>
                (local_460,
                 (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                  )local_468,&local_470);
      p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_80,(long)local_3bc);
      peVar27 = std::
                __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var28);
      local_478._M_current =
           (longlong *)std::vector<long_long,_std::allocator<long_long>_>::begin(peVar27);
      p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_80,(long)local_3bc);
      peVar27 = std::
                __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var28);
      local_480 = (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(peVar27);
      local_488 = 0.0;
      std::
      fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,double>
                (local_478,
                 (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                  )local_480,&local_488);
      p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_a0,(long)local_3bc);
      peVar27 = std::
                __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var28);
      local_490._M_current =
           (longlong *)std::vector<long_long,_std::allocator<long_long>_>::begin(peVar27);
      p_Var28 = (__shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_a0,(long)local_3bc);
      peVar27 = std::
                __shared_ptr_access<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var28);
      local_498 = (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(peVar27);
      local_4a0 = 0.0;
      std::
      fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,double>
                (local_490,
                 (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                  )local_498,&local_4a0);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_50,(long)local_3bc);
      std::
      stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
      ::push((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
              *)&rowsToReuse_R.c.
                 super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,pvVar20);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_80,(long)local_3bc);
      std::
      stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
      ::push((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
              *)&rowsToReuse_I.c.
                 super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,pvVar20);
      pvVar20 = std::
                vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)local_a0,(long)local_3bc);
      std::
      stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
      ::push((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
              *)&i,pvVar20);
    }
  }
  cost1_L.
  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  ::~stack((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
            *)&i);
  std::
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  ::~stack((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
            *)&rowsToReuse_I.c.
               super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  ::~stack((stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
            *)&rowsToReuse_R.c.
               super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &strategypointer_parent_v);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Ipointer_parent_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Rpointer_parent_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)&strategypointer_v);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Ipointer_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)
             &cost_Rpointer_v.
              super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> *)local_138);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_120);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_100);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_e0);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_c0);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             *)local_a0);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             *)local_80);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             *)local_50);
  if ((cost1_L.
       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    data_structures::Matrix<double>::~Matrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

data_structures::Matrix<double> APTEDTreeIndex<CostModel, TreeIndex>::compute_opt_strategy_postL(const TreeIndex& t1, const TreeIndex& t2) {
  const int size1 = t1.tree_size_;
  const int size2 = t2.tree_size_;
  data_structures::Matrix<double> strategy(size1, size2);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_L(size1);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_R(size1);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_I(size1);
  std::vector<long long int> cost2_L(size2);
  std::vector<long long int> cost2_R(size2);
  std::vector<long long int> cost2_I(size2);
  std::vector<double> cost2_path(size2);
  std::shared_ptr<std::vector<long long int>> leafRow(new std::vector<long long int>(size2));
  double pathIDOffset = static_cast<double>(size1);
  long long int minCost = std::numeric_limits<long long int>::max();
  double strategyPath = -1.0;

  const std::vector<int>& pre2size1 = t1.prel_to_size_;
  const std::vector<int>& pre2size2 = t2.prel_to_size_;
  const std::vector<long long int>& pre2descSum1 = t1.prel_to_cost_all_;
  const std::vector<long long int>& pre2descSum2 = t2.prel_to_cost_all_;
  const std::vector<long long int>& pre2krSum1 = t1.prel_to_cost_left_;
  const std::vector<long long int>& pre2krSum2 = t2.prel_to_cost_left_;
  const std::vector<long long int>& pre2revkrSum1 = t1.prel_to_cost_right_;
  const std::vector<long long int>& pre2revkrSum2 = t2.prel_to_cost_right_;
  const std::vector<int>& preL_to_preR_1 = t1.prel_to_prer_;
  const std::vector<int>& preL_to_preR_2 = t2.prel_to_prer_;
  const std::vector<int>& preR_to_preL_1 = t1.prer_to_prel_;
  const std::vector<int>& preR_to_preL_2 = t2.prer_to_prel_;
  const std::vector<int>& pre2parent1 = t1.prel_to_parent_;
  const std::vector<int>& pre2parent2 = t2.prel_to_parent_;
  const std::vector<bool>& nodeType_L_1 = t1.prel_to_type_left_;
  const std::vector<bool>& nodeType_L_2 = t2.prel_to_type_left_;
  const std::vector<bool>& nodeType_R_1 = t1.prel_to_type_right_;
  const std::vector<bool>& nodeType_R_2 = t2.prel_to_type_right_;

  const std::vector<int>& preL_to_postL_1 = t1.prel_to_postl_;
  const std::vector<int>& preL_to_postL_2 = t2.prel_to_postl_;

  const std::vector<int>& postL_to_preL_1 = t1.postl_to_prel_;
  const std::vector<int>& postL_to_preL_2 = t2.postl_to_prel_;

  int size_v = -1;
  int parent_v_preL = -1;
  int parent_w_preL = -1;
  int parent_w_postL = -1;
  int size_w = -1;
  int parent_v_postL = -1;
  double leftPath_v;
  double rightPath_v;
  std::shared_ptr<std::vector<long long int>> cost_Lpointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Rpointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Ipointer_v;
  // std::vector<double>* strategypointer_v;
  std::size_t strategypointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Lpointer_parent_v;
  std::shared_ptr<std::vector<long long int>> cost_Rpointer_parent_v;
  std::shared_ptr<std::vector<long long int>> cost_Ipointer_parent_v;
  // std::vector<double>* strategypointer_parent_v;
  std::size_t strategypointer_parent_v;
  long long int krSum_v;
  long long int revkrSum_v;
  long long int descSum_v;
  bool is_v_leaf;

  int v_in_preL;
  int w_in_preL;

  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_L;
  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_R;
  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_I;

  for(int v = 0; v < size1; ++v) {
    v_in_preL = postL_to_preL_1[v];

    is_v_leaf = t1.prel_to_size_[v_in_preL] == 1;
    parent_v_preL = pre2parent1[v_in_preL];

    if (parent_v_preL != -1) {
      parent_v_postL = preL_to_postL_1[parent_v_preL];
    }

    // strategypointer_v = strategy[v_in_preL];
    strategypointer_v = v_in_preL;

    size_v = pre2size1[v_in_preL];
    leftPath_v = static_cast<double>(-(preR_to_preL_1[preL_to_preR_1[v_in_preL] + size_v - 1] + 1));// this is the left path's ID which is the leftmost leaf node: l-r_preorder(r-l_preorder(v) + |Fv| - 1)
    rightPath_v = static_cast<double>(v_in_preL + size_v - 1 + 1); // this is the right path's ID which is the rightmost leaf node: l-r_preorder(v) + |Fv| - 1

    krSum_v = pre2krSum1[v_in_preL];
    revkrSum_v = pre2revkrSum1[v_in_preL];
    descSum_v = pre2descSum1[v_in_preL];

    if(is_v_leaf) {
      cost1_L[v] = leafRow;
      cost1_R[v] = leafRow;
      cost1_I[v] = leafRow;
      for(int i = 0; i < size2; ++i) {
        // strategypointer_v[postL_to_preL_2[i]] = v_in_preL;
        strategy.at(strategypointer_v, postL_to_preL_2[i]) = static_cast<double>(v_in_preL);
      }
    }

    cost_Lpointer_v = cost1_L[v];
    cost_Rpointer_v = cost1_R[v];
    cost_Ipointer_v = cost1_I[v];

    if(parent_v_preL != -1 && cost1_L[parent_v_postL] == nullptr) {
      if (rowsToReuse_L.empty()) {
        cost1_L[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
        cost1_R[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
        cost1_I[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
      } else {
        cost1_L[parent_v_postL] = rowsToReuse_L.top();
        cost1_R[parent_v_postL] = rowsToReuse_R.top();
        cost1_I[parent_v_postL] = rowsToReuse_I.top();
        rowsToReuse_L.pop();
        rowsToReuse_R.pop();
        rowsToReuse_I.pop();
      }
    }

    if (parent_v_preL != -1) {
      cost_Lpointer_parent_v = cost1_L[parent_v_postL];
      cost_Rpointer_parent_v = cost1_R[parent_v_postL];
      cost_Ipointer_parent_v = cost1_I[parent_v_postL];
      // strategypointer_parent_v = strategy[parent_v_preL];
      strategypointer_parent_v = parent_v_preL;
    }

    // Arrays.fill(cost2_L, 0L);
    std::fill(cost2_L.begin(),cost2_L.end(), 0);
    // Arrays.fill(cost2_R, 0L);
    std::fill(cost2_R.begin(),cost2_R.end(), 0);
    // Arrays.fill(cost2_I, 0L);
    std::fill(cost2_I.begin(),cost2_I.end(), 0);
    // Arrays.fill(cost2_path, 0);
    std::fill(cost2_path.begin(),cost2_path.end(), 0);

    for(int w = 0; w < size2; ++w) {
      w_in_preL = postL_to_preL_2[w];

      parent_w_preL = pre2parent2[w_in_preL];
      if (parent_w_preL != -1) {
        parent_w_postL = preL_to_postL_2[parent_w_preL];
      }

      size_w = pre2size2[w_in_preL];
      if (t2.prel_to_size_[w_in_preL] == 1) {
        cost2_L[w] = 0;
        cost2_R[w] = 0;
        cost2_I[w] = 0;
        cost2_path[w] = w_in_preL;
      }
      minCost = std::numeric_limits<long long int>::max();
      strategyPath = -1.0;
      long long int tmpCost = std::numeric_limits<long long int>::max();

      if (size_v <= 1 || size_w <= 1) { // USE NEW SINGLE_PATH FUNCTIONS FOR SMALL SUBTREES
        minCost = std::max(size_v, size_w);
      } else {
        tmpCost = size_v * pre2krSum2[w_in_preL] + (*cost_Lpointer_v)[w];
        // std::cout << "tmpCost [1] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = leftPath_v;
          // std::cout << "strategyPath [1] = " << strategyPath << std::endl;
        }
        tmpCost = size_v * pre2revkrSum2[w_in_preL] + (*cost_Rpointer_v)[w];
        // std::cout << "tmpCost [2] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = rightPath_v;
          // std::cout << "strategyPath [2] = " << strategyPath << std::endl;
        }
        tmpCost = size_v * pre2descSum2[w_in_preL] + (*cost_Ipointer_v)[w];
        // std::cout << "tmpCost [3] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          // strategyPath = (int)strategypointer_v[w_in_preL] + 1;
          strategyPath = strategy.at(strategypointer_v, w_in_preL) + 1.0;
          // std::cout << "strategyPath [3] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * krSum_v + cost2_L[w];
        // std::cout << "tmpCost [4] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = static_cast<double>(-(preR_to_preL_2[preL_to_preR_2[w_in_preL] + size_w - 1] + pathIDOffset + 1.0));
          // std::cout << "strategyPath [4] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * revkrSum_v + cost2_R[w];
        // std::cout << "tmpCost [5] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = static_cast<double>(w_in_preL + size_w - 1) + pathIDOffset + 1.0;
          // std::cout << "strategyPath [5] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * descSum_v + cost2_I[w];
        // std::cout << "tmpCost [6] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = cost2_path[w] + pathIDOffset + 1.0;
          // std::cout << "strategyPath [6] = " << strategyPath << std::endl;
        }
      }

      // std::cout << "minCost = " << minCost << std::endl;

      if (parent_v_preL != -1) {
        (*cost_Rpointer_parent_v)[w] += minCost;
        tmpCost = -minCost + (*cost1_I[v])[w];
        if (tmpCost < (*cost1_I[parent_v_postL])[w]) {
          (*cost_Ipointer_parent_v)[w] = tmpCost;
          // strategypointer_parent_v[w_in_preL] = strategypointer_v[w_in_preL];
          strategy.at(strategypointer_parent_v, w_in_preL) = strategy.read_at(strategypointer_v, w_in_preL);
        }
        if (nodeType_R_1[v_in_preL]) {
          (*cost_Ipointer_parent_v)[w] += (*cost_Rpointer_parent_v)[w];
          (*cost_Rpointer_parent_v)[w] += (*cost_Rpointer_v)[w] - minCost;
        }
        if (nodeType_L_1[v_in_preL]) {
          (*cost_Lpointer_parent_v)[w] += (*cost_Lpointer_v)[w];
        } else {
          (*cost_Lpointer_parent_v)[w] += minCost;
        }
      }
      if (parent_w_preL != -1) {
        cost2_R[parent_w_postL] += minCost;
        tmpCost = -minCost + cost2_I[w];
        if (tmpCost < cost2_I[parent_w_postL]) {
          cost2_I[parent_w_postL] = tmpCost;
          cost2_path[parent_w_postL] = cost2_path[w];
        }
        if (nodeType_R_2[w_in_preL]) {
          cost2_I[parent_w_postL] += cost2_R[parent_w_postL];
          cost2_R[parent_w_postL] += cost2_R[w] - minCost;
        }
        if (nodeType_L_2[w_in_preL]) {
          cost2_L[parent_w_postL] += cost2_L[w];
        } else {
          cost2_L[parent_w_postL] += minCost;
        }
      }
      // strategypointer_v[w_in_preL] = strategyPath;
      strategy.at(strategypointer_v, w_in_preL) = strategyPath;
      // std::cout << "strategy[" << strategypointer_v << "," << w_in_preL << "] = " << strategy.read_at(0, 0) << std::endl;
    }

    if (!(t1.prel_to_size_[v_in_preL] == 1)) {
      // Arrays.fill(cost1_L[v], 0);
      std::fill(cost1_L[v]->begin(), cost1_L[v]->end(), 0.0);
      // Arrays.fill(cost1_R[v], 0);
      std::fill(cost1_R[v]->begin(), cost1_R[v]->end(), 0.0);
      // Arrays.fill(cost1_I[v], 0);
      std::fill(cost1_I[v]->begin(), cost1_I[v]->end(), 0.0);
      rowsToReuse_L.push(cost1_L[v]);
      rowsToReuse_R.push(cost1_R[v]);
      rowsToReuse_I.push(cost1_I[v]);
      // NOTE: The pointers under cost1_L[v] do not have to be nulled.
    }

  }
  
  // std::cout << "strategy[0][0] = " << strategy.read_at(0, 0) << std::endl;
  return strategy;
}